

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_join_internal.h
# Opt level: O0

string * absl::strings_internal::
         JoinAlgorithm<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                   (string *param_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2,
                   undefined8 param_3,size_t param_4,char *param_5)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__dest;
  bool bVar1;
  reference __dest_00;
  void *pvVar2;
  size_t sVar3;
  long lVar4;
  const_pointer __src;
  size_type sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it_1;
  char *result_buf;
  char *absl_raw_log_internal_filename;
  string death_message;
  uint64_t kMaxSize;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  uint64_t result_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *start_value;
  string *result;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  undefined8 local_50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  long local_40;
  reference local_38;
  undefined1 local_2a;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  undefined8 local_18;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_10;
  string *local_8;
  
  local_2a = 0;
  local_28._M_len = param_4;
  local_28._M_str = param_5;
  local_18 = param_3;
  local_10._M_current = param_2;
  local_8 = param_1;
  std::__cxx11::string::string((string *)param_1);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  if (bVar1) {
    local_38 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_10);
    local_40 = std::__cxx11::string::size();
    local_48._M_current = local_10._M_current;
    while( true ) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_48);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      if (!bVar1) break;
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_28);
      local_40 = sVar5 + local_40;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_48);
      lVar4 = std::__cxx11::string::size();
      local_40 = lVar4 + local_40;
    }
    if (local_40 != 0) {
      local_50 = 0xffffffffffffffff;
      STLStringResizeUninitialized<std::__cxx11::string,void>
                (in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
      local_d0._M_current = (char *)std::__cxx11::string::begin();
      __dest_00 = __gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&local_d0);
      local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__dest_00;
      pvVar2 = (void *)std::__cxx11::string::data();
      sVar3 = std::__cxx11::string::size();
      memcpy(__dest_00,pvVar2,sVar3);
      lVar4 = std::__cxx11::string::size();
      local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)local_c8 + lVar4);
      local_d8._M_current = local_10._M_current;
      while( true ) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_d8);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        if (!bVar1) break;
        in_stack_fffffffffffffed0 = local_c8;
        __src = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_28);
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_28);
        memcpy(in_stack_fffffffffffffed0,__src,sVar5);
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_28);
        local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (&local_c8->_M_dataplus + sVar5);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_d8);
        __dest = local_c8;
        pvVar2 = (void *)std::__cxx11::string::data();
        sVar3 = std::__cxx11::string::size();
        memcpy(__dest,pvVar2,sVar3);
        lVar4 = std::__cxx11::string::size();
        local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)local_c8 + lVar4);
      }
    }
  }
  return param_1;
}

Assistant:

std::string JoinAlgorithm(Iterator start, Iterator end, absl::string_view s,
                          NoFormatter) {
  std::string result;
  if (start != end) {
    // Sums size
    auto&& start_value = *start;
    // Use uint64_t to prevent size_t overflow. We assume it is not possible for
    // in memory strings to overflow a uint64_t.
    uint64_t result_size = start_value.size();
    for (Iterator it = start; ++it != end;) {
      result_size += s.size();
      result_size += (*it).size();
    }

    if (result_size > 0) {
      constexpr uint64_t kMaxSize =
          uint64_t{(std::numeric_limits<size_t>::max)()};
      ABSL_INTERNAL_CHECK(result_size <= kMaxSize, "size_t overflow");
      STLStringResizeUninitialized(&result, static_cast<size_t>(result_size));

      // Joins strings
      char* result_buf = &*result.begin();

      memcpy(result_buf, start_value.data(), start_value.size());
      result_buf += start_value.size();
      for (Iterator it = start; ++it != end;) {
        memcpy(result_buf, s.data(), s.size());
        result_buf += s.size();
        auto&& value = *it;
        memcpy(result_buf, value.data(), value.size());
        result_buf += value.size();
      }
    }
  }

  return result;
}